

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 ngram_model_add_class_word(ngram_model_t *model,char *classname,char *word,float32 weight)

{
  ngram_class_t *lmclass_00;
  int32 iVar1;
  int iVar2;
  float fVar3;
  float32 fprob;
  int32 scale;
  int32 i;
  int32 wid;
  int32 tag_wid;
  int32 classid;
  ngram_class_t *lmclass;
  float32 weight_local;
  char *word_local;
  char *classname_local;
  ngram_model_t *model_local;
  
  iVar1 = ngram_wid(model,classname);
  if (iVar1 == -1) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x318,"No such word or class tag: %s\n",classname);
    model_local._4_4_ = -1;
  }
  else {
    wid = 0;
    while ((wid < (int)(uint)model->n_classes && (model->classes[wid]->tag_wid != iVar1))) {
      wid = wid + 1;
    }
    if (wid == (uint)model->n_classes) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
              ,0x323,"Word %s is not a class tag (call ngram_model_add_class() first)\n",classname);
      model_local._4_4_ = -1;
    }
    else {
      lmclass_00 = model->classes[wid];
      iVar1 = ngram_add_word_internal(model,word,wid);
      if (iVar1 == -1) {
        model_local._4_4_ = -1;
      }
      else {
        fVar3 = ((float)weight * 1.0) / (float)(lmclass_00->n_words + lmclass_00->n_hash_inuse + 1);
        iVar2 = logmath_log(model->lmath,(float64)(1.0 - (double)fVar3));
        for (fprob = 0.0; (int)fprob < lmclass_00->n_words; fprob = (float32)((int)fprob + 1)) {
          lmclass_00->prob1[(int)fprob] = iVar2 + lmclass_00->prob1[(int)fprob];
        }
        for (fprob = 0.0; (int)fprob < lmclass_00->n_hash; fprob = (float32)((int)fprob + 1)) {
          if (lmclass_00->nword_hash[(int)fprob].wid != -1) {
            lmclass_00->nword_hash[(int)fprob].prob1 =
                 iVar2 + lmclass_00->nword_hash[(int)fprob].prob1;
          }
        }
        iVar2 = logmath_log(model->lmath,(float64)(double)fVar3);
        model_local._4_4_ = ngram_class_add_word(lmclass_00,iVar1,iVar2);
      }
    }
  }
  return model_local._4_4_;
}

Assistant:

int32
ngram_model_add_class_word(ngram_model_t * model,
                           const char *classname,
                           const char *word, float32 weight)
{
    ngram_class_t *lmclass;
    int32 classid, tag_wid, wid, i, scale;
    float32 fprob;

    /* Find the class corresponding to classname.  Linear search
     * probably okay here since there won't be very many classes, and
     * this doesn't have to be fast. */
    tag_wid = ngram_wid(model, classname);
    if (tag_wid == NGRAM_INVALID_WID) {
        E_ERROR("No such word or class tag: %s\n", classname);
        return tag_wid;
    }
    for (classid = 0; classid < model->n_classes; ++classid) {
        if (model->classes[classid]->tag_wid == tag_wid)
            break;
    }
    /* Hmm, no such class.  It's probably not a good idea to create one. */
    if (classid == model->n_classes) {
        E_ERROR
            ("Word %s is not a class tag (call ngram_model_add_class() first)\n",
             classname);
        return NGRAM_INVALID_WID;
    }
    lmclass = model->classes[classid];

    /* Add this word to the model's set of words. */
    wid = ngram_add_word_internal(model, word, classid);
    if (wid == NGRAM_INVALID_WID)
        return wid;

    /* This is the fixed probability of the new word. */
    fprob = weight * 1.0f / (lmclass->n_words + lmclass->n_hash_inuse + 1);
    /* Now normalize everything else to fit it in.  This is
     * accomplished by simply scaling all the other probabilities
     * by (1-fprob). */
    scale = logmath_log(model->lmath, 1.0 - fprob);
    for (i = 0; i < lmclass->n_words; ++i)
        lmclass->prob1[i] += scale;
    for (i = 0; i < lmclass->n_hash; ++i)
        if (lmclass->nword_hash[i].wid != -1)
            lmclass->nword_hash[i].prob1 += scale;

    /* Now add it to the class hash table. */
    return ngram_class_add_word(lmclass, wid,
                                logmath_log(model->lmath, fprob));
}